

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O3

int __thiscall BER_CONTAINER::fromBuffer(BER_CONTAINER *this,uint8_t *buf,size_t max_len)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar3 = -0xc;
  if ((1 < max_len) && (iVar3 = -0xf, this->_type == (uint)*buf)) {
    bVar1 = buf[1];
    uVar2 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      if ((bVar1 & 0x7f) == 0) {
        uVar2 = 0;
      }
      else {
        lVar5 = 0;
        uVar2 = 0;
        do {
          uVar2 = (uint)buf[lVar5 + 2] | uVar2 << 8;
          lVar5 = lVar5 + 1;
        } while ((bVar1 & 0x7f) != (uint)lVar5);
      }
      this->_length = uVar2;
      iVar4 = (bVar1 & 0x7f) + 1;
    }
    else {
      this->_length = (uint)bVar1;
      iVar4 = 1;
    }
    iVar3 = -0xb;
    if ((long)(int)uVar2 + 2U <= max_len) {
      iVar3 = iVar4 + 1;
    }
  }
  return iVar3;
}

Assistant:

int BER_CONTAINER::fromBuffer(const uint8_t *buf, size_t max_len) {
    // In the base class we are going to double check our type, and decode the length of this structure, then return bytes read
    if(max_len < 2) return SNMP_BUFFER_ERROR_TLV_TOO_SMALL; // Too small for any type

    const uint8_t* ptr = buf;
    if(*ptr != _type){
        SNMP_LOGE("Mismatched type when decoding %d, %d\n", _type, *ptr);
        return SNMP_BUFFER_ERROR_TYPE_MISMATCH;
    }
    ptr++; // type
    ptr += decode_ber_length_integer(ptr, &_length, max_len);
    if((size_t)_length + 2 > max_len){
        // length of object is too big to read in
        return SNMP_BUFFER_ERROR_MAX_LEN_EXCEEDED;
    }

    return ptr - buf;
}